

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O2

RK_S32 h265d_split_init(void **sc)

{
  RK_S32 extraout_EAX;
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)mpp_osal_calloc("h265d_split_init",0x100);
  if (puVar1 != (undefined8 *)0x0) {
    *sc = puVar1;
    pvVar2 = mpp_osal_malloc("h265d_split_init",0x1f4000);
    *puVar1 = pvVar2;
    *(undefined4 *)(puVar1 + 1) = 0x1f4000;
    *(undefined4 *)(puVar1 + 0xd) = 1;
    return (RK_S32)pvVar2;
  }
  _mpp_log_l(2,"H265D_PARSER","split alloc context fail",(char *)0x0);
  return extraout_EAX;
}

Assistant:

static RK_S32 h265d_split_init(void **sc)
{
    SplitContext_t *s = NULL;
    if (s == NULL) {
        s = mpp_calloc(SplitContext_t, 1);
        if (s != NULL) {
            *sc = s;
        } else {
            mpp_err("split alloc context fail");
            return MPP_ERR_NOMEM;
        }
    }
    s->buffer = mpp_malloc(RK_U8, MAX_FRAME_SIZE);
    s->buffer_size = MAX_FRAME_SIZE;
    s->fetch_timestamp = 1;
    return MPP_OK;
}